

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_A_IceSetTics(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  AActor *thing;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005567f7;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005567e7;
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_00556707;
    bVar2 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005567f7;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_005567e7;
LAB_00556707:
    thing = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_00556787;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005567e7:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005567f7;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005567f7;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005567e7;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00556787:
    uVar3 = FRandom::operator()(&pr_icesettics);
    thing->tics = (uVar3 & 0x3f) + 0x46;
    iVar4 = P_GetThingFloorType(thing);
    iVar4 = Terrains.Array[iVar4].DamageMOD.Index;
    if (iVar4 == 0x33) {
      iVar4 = thing->tics * 2;
    }
    else {
      if (iVar4 != 0x9f) {
        return 0;
      }
      iVar4 = thing->tics >> 2;
    }
    thing->tics = iVar4;
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005567f7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceSetTics)
{
	PARAM_ACTION_PROLOGUE;

	int floor;

	self->tics = 70+(pr_icesettics()&63);
	floor = P_GetThingFloorType (self);
	if (Terrains[floor].DamageMOD == NAME_Fire)
	{
		self->tics >>= 2;
	}
	else if (Terrains[floor].DamageMOD == NAME_Ice)
	{
		self->tics <<= 1;
	}
	return 0;
}